

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNHeap::Scan(TopNHeap *this,TopNScanState *state,DataChunk *chunk,idx_t *pos)

{
  pointer puVar1;
  pointer puVar2;
  idx_t iVar3;
  SelectionVector sel;
  SelectionVector SStack_48;
  
  puVar1 = (state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*pos < (ulong)((long)(state->scan_order).
                           super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    SelectionVector::SelectionVector(&SStack_48,puVar1 + *pos);
    puVar1 = (state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar3 = *pos;
    *pos = iVar3 + 0x800;
    DataChunk::Reset(chunk);
    iVar3 = ((long)puVar2 - (long)puVar1 >> 2) - iVar3;
    if (0x7ff < iVar3) {
      iVar3 = 0x800;
    }
    DataChunk::Slice(chunk,&this->heap_data,&SStack_48,iVar3,0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&SStack_48.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void TopNHeap::Scan(TopNScanState &state, DataChunk &chunk, idx_t &pos) {
	if (pos >= state.scan_order.size()) {
		return;
	}
	SelectionVector sel(state.scan_order.data() + pos);
	idx_t count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.scan_order.size() - pos);
	pos += STANDARD_VECTOR_SIZE;

	chunk.Reset();
	chunk.Slice(heap_data, sel, count);
}